

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O2

void __thiscall trieste::wf::Sequence::gen(Sequence *this,Gen *g,size_t depth,Node *node)

{
  result_type rVar1;
  size_t i;
  ulong uVar2;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  for (uVar2 = 0; uVar2 < this->minlen; uVar2 = uVar2 + 1) {
    std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
    Choice::gen(&this->choice,g,depth,(Node *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  while( true ) {
    rVar1 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::operator()
                      (&g->rand);
    if ((rVar1 & 1) == 0) break;
    std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
    Choice::gen(&this->choice,g,depth,(Node *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return;
}

Assistant:

void gen(Gen& g, size_t depth, Node node) const
      {
        for (size_t i = 0; i < minlen; ++i)
          choice.gen(g, depth, node);

        while (g.next() % 2)
          choice.gen(g, depth, node);
      }